

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sse_sse4.c
# Opt level: O2

void sse4x2_sse4_1(uint8_t *a,int a_stride,uint8_t *b,int b_stride,__m128i *sum)

{
  int iVar1;
  int iVar2;
  longlong lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  auVar4._4_4_ = *(undefined4 *)(a + a_stride);
  auVar4._0_4_ = *(undefined4 *)a;
  auVar4._8_8_ = 0;
  auVar4 = pmovzxbw(auVar4,auVar4);
  auVar6._4_4_ = *(undefined4 *)(b + b_stride);
  auVar6._0_4_ = *(undefined4 *)b;
  auVar6._8_8_ = 0;
  auVar6 = pmovzxbw(auVar6,auVar6);
  auVar5._0_2_ = auVar4._0_2_ - auVar6._0_2_;
  auVar5._2_2_ = auVar4._2_2_ - auVar6._2_2_;
  auVar5._4_2_ = auVar4._4_2_ - auVar6._4_2_;
  auVar5._6_2_ = auVar4._6_2_ - auVar6._6_2_;
  auVar5._8_2_ = auVar4._8_2_ - auVar6._8_2_;
  auVar5._10_2_ = auVar4._10_2_ - auVar6._10_2_;
  auVar5._12_2_ = auVar4._12_2_ - auVar6._12_2_;
  auVar5._14_2_ = auVar4._14_2_ - auVar6._14_2_;
  auVar4 = pmaddwd(auVar5,auVar5);
  iVar1 = *(int *)((long)*sum + 4);
  lVar3 = (*sum)[1];
  iVar2 = *(int *)((long)*sum + 0xc);
  *(int *)*sum = auVar4._0_4_ + (int)(*sum)[0];
  *(int *)((long)*sum + 4) = auVar4._4_4_ + iVar1;
  *(int *)(*sum + 1) = auVar4._8_4_ + (int)lVar3;
  *(int *)((long)*sum + 0xc) = auVar4._12_4_ + iVar2;
  return;
}

Assistant:

static inline void sse4x2_sse4_1(const uint8_t *a, int a_stride,
                                 const uint8_t *b, int b_stride, __m128i *sum) {
  const __m128i v_a0 = xx_loadl_32(a);
  const __m128i v_a1 = xx_loadl_32(a + a_stride);
  const __m128i v_b0 = xx_loadl_32(b);
  const __m128i v_b1 = xx_loadl_32(b + b_stride);
  const __m128i v_a_w = _mm_cvtepu8_epi16(_mm_unpacklo_epi32(v_a0, v_a1));
  const __m128i v_b_w = _mm_cvtepu8_epi16(_mm_unpacklo_epi32(v_b0, v_b1));
  const __m128i v_d_w = _mm_sub_epi16(v_a_w, v_b_w);
  *sum = _mm_add_epi32(*sum, _mm_madd_epi16(v_d_w, v_d_w));
}